

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_perms.c
# Opt level: O0

void test_write_disk_perms(void)

{
  __syscall_slong_t _Var1;
  __uid_t _Var2;
  __gid_t _Var3;
  int iVar4;
  archive *a_00;
  archive_entry *paVar5;
  ulong uVar6;
  uint local_b0;
  uint local_ac;
  uid_t try_to_change_uid;
  uid_t original_uid;
  stat_conflict st;
  archive_entry *ae;
  archive *a;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                  ,L'\x88',L'\x12');
  _Var2 = getuid();
  _Var3 = getgid();
  iVar4 = chown(".",_Var2,_Var3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'\x91',0,"0",(long)iVar4,"chown(\".\", getuid(), getgid())",(void *)0x0);
  a_00 = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'\x94',(uint)(a_00 != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'\x97',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_0755");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'\xa0',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_overwrite_0144");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'¥',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  iVar4 = stat("file_overwrite_0144",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'§',0,"0",(long)iVar4,"stat(\"file_overwrite_0144\", &st)",(void *)0x0);
  failure("file_overwrite_0144: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'©',(uint)(((uint)st.st_nlink & 0xfff) != 100),"(st.st_mode & 07777) != 0144",
                   (void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'«',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_overwrite_0144");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x8064);
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'®',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'°',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'³',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"dir_0514");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x414c);
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'¶',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'¸',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'¼',"dir_overwrite_0744",L'Ǥ');
  iVar4 = stat("dir_overwrite_0744",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'¾',0,"0",(long)iVar4,"stat(\"dir_overwrite_0744\", &st)",(void *)0x0);
  failure("dir_overwrite_0744: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'À',(ulong)((uint)st.st_nlink & 0x1ff),"st.st_mode & 0777",0x1e4,"0744",
                      (void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'Â',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"dir_overwrite_0744");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x41ff);
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ç',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  iVar4 = stat("dir_overwrite_0744",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'É',0,"0",(long)iVar4,"stat(\"dir_overwrite_0744\", &st)",(void *)0x0);
  failure("dir_overwrite_0744: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ë',(ulong)((uint)st.st_nlink & 0x1ff),"st.st_mode & 0777",0x1e4,"0744",
                      (void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Î',"dir_owner",L'Ǥ');
  _Var2 = getuid();
  if (_Var2 == 0) {
    local_ac = getuid();
    local_ac = local_ac + 1;
    local_b0 = getuid();
    _Var3 = getgid();
    iVar4 = chown("dir_owner",local_ac,_Var3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ó',0,"0",(long)iVar4,"chown(\"dir_owner\", original_uid, getgid())",
                        (void *)0x0);
  }
  else {
    local_ac = getuid();
    local_b0 = getuid();
    local_b0 = local_b0 + 1;
  }
  iVar4 = stat("dir_owner",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ú',0,"0",(long)iVar4,"stat(\"dir_owner\", &st)",(void *)0x0);
  failure("dir_owner: st.st_uid=%jd",(ulong)st.st_nlink._4_4_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ü',(ulong)st.st_nlink._4_4_,"st.st_uid",(ulong)local_ac,"original_uid",
                      (void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'Þ',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"dir_owner");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x41e4);
  archive_entry_set_uid((archive_entry *)st.__glibc_reserved[2],(ulong)local_b0);
  archive_write_disk_set_options(a_00,L'\t');
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'æ',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  iVar4 = stat("dir_owner",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'è',0,"0",(long)iVar4,"stat(\"dir_owner\", &st)",(void *)0x0);
  failure("dir_owner: st.st_uid=%jd",(ulong)st.st_nlink._4_4_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ê',(ulong)st.st_nlink._4_4_,"st.st_uid",(ulong)local_ac,"original_uid",
                      (void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'í',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_no_suid");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x89ff);
  archive_write_disk_set_options(a_00,L'\0');
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ñ',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ò',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'õ',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_0777");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  archive_write_disk_set_options(a_00,L'\x02');
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ù',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ú',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'ý',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_4742");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x89e2);
  _Var1 = st.__glibc_reserved[2];
  _Var2 = getuid();
  archive_entry_set_uid((archive_entry *)_Var1,(ulong)_Var2);
  archive_write_disk_set_options(a_00,L'\x02');
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ă',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ă',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'Ċ',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_bad_suid");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x89e2);
  _Var1 = st.__glibc_reserved[2];
  _Var2 = getuid();
  archive_entry_set_uid((archive_entry *)_Var1,(ulong)(_Var2 + 1));
  archive_write_disk_set_options(a_00,L'\x02');
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'ď',(uint)(iVar4 == 0),"0 == archive_write_header(a, ae)",a_00);
  failure("Opportunistic SUID failure shouldn\'t return error.");
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ė',0,"0",(long)iVar4,"archive_write_finish_entry(a)",(void *)0x0);
  _Var2 = getuid();
  if (_Var2 != 0) {
    paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Ě',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL"
                     ,(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_bad_suid2");
    archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x89e2);
    _Var1 = st.__glibc_reserved[2];
    _Var2 = getuid();
    archive_entry_set_uid((archive_entry *)_Var1,(ulong)(_Var2 + 1));
    archive_write_disk_set_options(a_00,L'\x03');
    iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Ġ',(uint)(iVar4 == 0),"0 == archive_write_header(a, ae)",a_00);
    failure("Non-opportunistic SUID failure should return error.");
    iVar4 = archive_write_finish_entry(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ģ',-0x14,"ARCHIVE_WARN",(long)iVar4,"archive_write_finish_entry(a)",
                        (void *)0x0);
  }
  paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'ħ',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_perm_sgid");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x85e2);
  _Var1 = st.__glibc_reserved[2];
  iVar4 = defaultgid();
  archive_entry_set_gid((archive_entry *)_Var1,(long)iVar4);
  archive_write_disk_set_options(a_00,L'\x02');
  iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
  failure("Setting SGID bit should succeed here.");
  iVar4 = archive_write_finish_entry(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Į',0,"0",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  iVar4 = altgid();
  if (iVar4 == -1) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'ĵ');
    test_skipping("Current user can\'t test gid restore: must belong to more than one group.");
  }
  else {
    paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Ō',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL"
                     ,(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_alt_sgid");
    archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x85e2);
    _Var1 = st.__glibc_reserved[2];
    _Var2 = getuid();
    archive_entry_set_uid((archive_entry *)_Var1,(ulong)_Var2);
    _Var1 = st.__glibc_reserved[2];
    iVar4 = altgid();
    archive_entry_set_gid((archive_entry *)_Var1,(long)iVar4);
    archive_write_disk_set_options(a_00,L'\x02');
    iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Œ',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
    failure(
           "Setting SGID bit should fail because of group mismatch but the failure should be silent because we didn\'t ask for the group to be set."
           );
    iVar4 = archive_write_finish_entry(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ŕ',0,"0",(long)iVar4,"archive_write_finish_entry(a)",a_00);
    paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Ś',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL"
                     ,(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_alt_sgid_owner");
    archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x85e2);
    _Var1 = st.__glibc_reserved[2];
    _Var2 = getuid();
    archive_entry_set_uid((archive_entry *)_Var1,(ulong)_Var2);
    _Var1 = st.__glibc_reserved[2];
    iVar4 = altgid();
    archive_entry_set_gid((archive_entry *)_Var1,(long)iVar4);
    archive_write_disk_set_options(a_00,L'\x03');
    iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'š',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",a_00);
    failure("Setting SGID bit should succeed here.");
    iVar4 = archive_write_finish_entry(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ţ',0,"ARCHIVE_OK",(long)iVar4,"archive_write_finish_entry(a)",a_00);
  }
  iVar4 = invalidgid();
  if (iVar4 == -1) {
    printf("Running as root: Can\'t test SGID failures.\n");
  }
  else {
    paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'ů',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL"
                     ,(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_bad_sgid");
    archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x85e2);
    _Var1 = st.__glibc_reserved[2];
    iVar4 = invalidgid();
    archive_entry_set_gid((archive_entry *)_Var1,(long)iVar4);
    archive_write_disk_set_options(a_00,L'\x02');
    iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Ŵ',(uint)(iVar4 == 0),"0 == archive_write_header(a, ae)",a_00);
    failure("This SGID restore should fail without an error.");
    iVar4 = archive_write_finish_entry(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ŷ',0,"0",(long)iVar4,"archive_write_finish_entry(a)",a_00);
    paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Ÿ',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL"
                     ,(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_bad_sgid2");
    archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x85e2);
    _Var1 = st.__glibc_reserved[2];
    iVar4 = invalidgid();
    archive_entry_set_gid((archive_entry *)_Var1,(long)iVar4);
    archive_write_disk_set_options(a_00,L'\x03');
    iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'ž',(uint)(iVar4 == 0),"0 == archive_write_header(a, ae)",a_00);
    failure("This SGID restore should fail with an error.");
    iVar4 = archive_write_finish_entry(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ƀ',-0x14,"ARCHIVE_WARN",(long)iVar4,"archive_write_finish_entry(a)",a_00
                       );
  }
  _Var2 = getuid();
  if (_Var2 == 0) {
    printf("Running as root: Can\'t test setuid failures.\n");
  }
  else {
    paVar5 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'Ƈ',(uint)(paVar5 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL"
                     ,(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"file_bad_owner");
    archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81e4);
    _Var1 = st.__glibc_reserved[2];
    _Var2 = getuid();
    archive_entry_set_uid((archive_entry *)_Var1,(ulong)(_Var2 + 1));
    archive_write_disk_set_options(a_00,L'\x01');
    iVar4 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'ƌ',(uint)(iVar4 == 0),"0 == archive_write_header(a, ae)",a_00);
    iVar4 = archive_write_finish_entry(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ƍ',-0x14,"ARCHIVE_WARN",(long)iVar4,"archive_write_finish_entry(a)",a_00
                       );
  }
  iVar4 = archive_write_free(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ɛ',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar4 = stat("file_0755",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ɣ',0,"0",(long)iVar4,"stat(\"file_0755\", &st)",(void *)0x0);
  failure("file_0755: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ɩ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1ed,"0755",
                      (void *)0x0);
  iVar4 = stat("file_overwrite_0144",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ƙ',0,"0",(long)iVar4,"stat(\"file_overwrite_0144\", &st)",(void *)0x0);
  failure("file_overwrite_0144: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ƚ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",100,"0144",
                      (void *)0x0);
  iVar4 = stat("dir_0514",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ɯ',0,"0",(long)iVar4,"stat(\"dir_0514\", &st)",(void *)0x0);
  failure("dir_0514: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ƞ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x14c,"0514",
                      (void *)0x0);
  iVar4 = stat("dir_overwrite_0744",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ơ',0,"0",(long)iVar4,"stat(\"dir_overwrite_0744\", &st)",(void *)0x0);
  failure("dir_overwrite_0744: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ƣ',(ulong)((uint)st.st_nlink & 0x1ff),"st.st_mode & 0777",0x1e4,"0744",
                      (void *)0x0);
  iVar4 = stat("file_no_suid",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ƥ',0,"0",(long)iVar4,"stat(\"file_no_suid\", &st)",(void *)0x0);
  failure("file_0755: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ʀ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1ed,"0755",
                      (void *)0x0);
  iVar4 = stat("file_0777",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ƨ',0,"0",(long)iVar4,"stat(\"file_0777\", &st)",(void *)0x0);
  failure("file_0777: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ƪ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1ff,"0777",
                      (void *)0x0);
  iVar4 = stat("file_4742",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ƭ',0,"0",(long)iVar4,"stat(\"file_4742\", &st)",(void *)0x0);
  failure("file_4742: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ư',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x9e2,
                      "S_ISUID | 0742",(void *)0x0);
  iVar4 = stat("file_bad_suid",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'Ʋ',0,"0",(long)iVar4,"stat(\"file_bad_suid\", &st)",(void *)0x0);
  failure("file_bad_suid: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ƴ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1e2,"0742",
                      (void *)0x0);
  _Var2 = getuid();
  if (_Var2 != 0) {
    iVar4 = stat("file_bad_suid2",(stat *)&try_to_change_uid);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ƹ',0,"0",(long)iVar4,"stat(\"file_bad_suid2\", &st)",(void *)0x0);
    failure("file_bad_suid2: st.st_mode=%o",(ulong)(uint)st.st_nlink);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ƻ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1e2,"0742",
                        (void *)0x0);
  }
  iVar4 = stat("file_perm_sgid",(stat *)&try_to_change_uid);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ƿ',0,"0",(long)iVar4,"stat(\"file_perm_sgid\", &st)",(void *)0x0);
  failure("file_perm_sgid: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                      ,L'ǁ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x5e2,
                      "S_ISGID | 0742",(void *)0x0);
  iVar4 = altgid();
  if (iVar4 != -1) {
    iVar4 = stat("file_alt_sgid",(stat *)&try_to_change_uid);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ǅ',0,"0",(long)iVar4,"stat(\"file_alt_sgid\", &st)",(void *)0x0);
    failure("file_alt_sgid: st.st_mode=%o",(ulong)(uint)st.st_nlink);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǉ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1e2,"0742",
                        (void *)0x0);
    iVar4 = stat("file_alt_sgid_owner",(stat *)&try_to_change_uid);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǌ',0,"0",(long)iVar4,"stat(\"file_alt_sgid_owner\", &st)",(void *)0x0);
    failure("file_alt_sgid: st.st_mode=%o",(ulong)(uint)st.st_nlink);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ǌ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x5e2,
                        "S_ISGID | 0742",(void *)0x0);
  }
  iVar4 = invalidgid();
  if (iVar4 != -1) {
    iVar4 = stat("file_bad_sgid",(stat *)&try_to_change_uid);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǒ',0,"0",(long)iVar4,"stat(\"file_bad_sgid\", &st)",(void *)0x0);
    failure("file_bad_sgid: st.st_mode=%o",(ulong)(uint)st.st_nlink);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǔ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1e2,"0742",
                        (void *)0x0);
    iVar4 = stat("file_bad_sgid2",(stat *)&try_to_change_uid);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǖ',0,"0",(long)iVar4,"stat(\"file_bad_sgid2\", &st)",(void *)0x0);
    failure("file_bad_sgid2: st.st_mode=%o",(ulong)(uint)st.st_nlink);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǘ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1e2,"0742",
                        (void *)0x0);
  }
  _Var2 = getuid();
  if (_Var2 != 0) {
    iVar4 = stat("file_bad_owner",(stat *)&try_to_change_uid);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǜ',0,"0",(long)iVar4,"stat(\"file_bad_owner\", &st)",(void *)0x0);
    failure("file_bad_owner: st.st_mode=%o",(ulong)(uint)st.st_nlink);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'ǝ',(ulong)((uint)st.st_nlink & 0xfff),"st.st_mode & 07777",0x1e4,"0744",
                        (void *)0x0);
    uVar6 = (ulong)st.st_nlink._4_4_;
    _Var2 = getuid();
    failure("file_bad_owner: st.st_uid=%jd getuid()=%jd",uVar6,(ulong)_Var2);
    _Var2 = getuid();
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                        ,L'Ǣ',(ulong)st.st_nlink._4_4_,"st.st_uid",(ulong)_Var2,"getuid()",
                        (void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_perms)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk interface");
#else
	struct archive *a;
	struct archive_entry *ae;
	struct stat st;
	uid_t original_uid;
	uid_t try_to_change_uid;

	assertUmask(UMASK);

	/*
	 * Set ownership of the current directory to the group of this
	 * process.  Otherwise, the SGID tests below fail if the
	 * /tmp directory is owned by a group to which we don't belong
	 * and we're on a system where group ownership is inherited.
	 * (Because we're not allowed to SGID files with defaultgid().)
	 */
	assertEqualInt(0, chown(".", getuid(), getgid()));

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);

	/* Write a regular file to it. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file_0755");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));
	archive_entry_free(ae);

	/* Write a regular file, then write over it. */
	/* For files, the perms should get updated. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file_overwrite_0144");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));
	/* Check that file was created with different perms. */
	assertEqualInt(0, stat("file_overwrite_0144", &st));
	failure("file_overwrite_0144: st.st_mode=%o", st.st_mode);
	assert((st.st_mode & 07777) != 0144);
	/* Overwrite, this should change the perms. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file_overwrite_0144");
	archive_entry_set_mode(ae, S_IFREG | 0144);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));

	/* Write a regular dir. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir_0514");
	archive_entry_set_mode(ae, S_IFDIR | 0514);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));

	/* Overwrite an existing dir. */
	/* For dir, the first perms should get left. */
	assertMakeDir("dir_overwrite_0744", 0744);
	/* Check original perms. */
	assertEqualInt(0, stat("dir_overwrite_0744", &st));
	failure("dir_overwrite_0744: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 0777, 0744);
	/* Overwrite shouldn't edit perms. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir_overwrite_0744");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));
	/* Make sure they're unchanged. */
	assertEqualInt(0, stat("dir_overwrite_0744", &st));
	failure("dir_overwrite_0744: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 0777, 0744);

	/* For dir, the owner should get left when not overwriting. */
	assertMakeDir("dir_owner", 0744);

	if (getuid() == 0) {
		original_uid = getuid() + 1;
		try_to_change_uid = getuid();
		assertEqualInt(0, chown("dir_owner", original_uid, getgid()));
	} else {
		original_uid = getuid();
		try_to_change_uid = getuid() + 1;
	}

	/* Check original owner. */
	assertEqualInt(0, stat("dir_owner", &st));
	failure("dir_owner: st.st_uid=%jd", (intmax_t)st.st_uid);
	assertEqualInt(st.st_uid, original_uid);
	/* Shouldn't try to edit the owner when no overwrite option is set. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir_owner");
	archive_entry_set_mode(ae, S_IFDIR | 0744);
	archive_entry_set_uid(ae, try_to_change_uid);
	archive_write_disk_set_options(a,
	    ARCHIVE_EXTRACT_OWNER | ARCHIVE_EXTRACT_NO_OVERWRITE);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));
	/* Make sure they're unchanged. */
	assertEqualInt(0, stat("dir_owner", &st));
	failure("dir_owner: st.st_uid=%jd", (intmax_t)st.st_uid);
	assertEqualInt(st.st_uid, original_uid);

	/* Write a regular file with SUID bit, but don't use _EXTRACT_PERM. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file_no_suid");
	archive_entry_set_mode(ae, S_IFREG | S_ISUID | 0777);
	archive_write_disk_set_options(a, 0);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));

	/* Write a regular file with ARCHIVE_EXTRACT_PERM. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "file_0777");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_PERM);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));

	/* Write a regular file with ARCHIVE_EXTRACT_PERM & SUID bit */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "file_4742");
	archive_entry_set_mode(ae, S_IFREG | S_ISUID | 0742);
	archive_entry_set_uid(ae, getuid());
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_PERM);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));

	/*
	 * Write a regular file with ARCHIVE_EXTRACT_PERM & SUID bit,
	 * but wrong uid.  POSIX says you shouldn't restore SUID bit
	 * unless the UID could be restored.
	 */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "file_bad_suid");
	archive_entry_set_mode(ae, S_IFREG | S_ISUID | 0742);
	archive_entry_set_uid(ae, getuid() + 1);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_PERM);
	assertA(0 == archive_write_header(a, ae));
	/*
	 * Because we didn't ask for owner, the failure to
	 * restore SUID shouldn't return a failure.
	 * We check below to make sure SUID really wasn't set.
	 * See more detailed comments below.
	 */
	failure("Opportunistic SUID failure shouldn't return error.");
	assertEqualInt(0, archive_write_finish_entry(a));

        if (getuid() != 0) {
		assert(archive_entry_clear(ae) != NULL);
		archive_entry_copy_pathname(ae, "file_bad_suid2");
		archive_entry_set_mode(ae, S_IFREG | S_ISUID | 0742);
		archive_entry_set_uid(ae, getuid() + 1);
		archive_write_disk_set_options(a,
		    ARCHIVE_EXTRACT_PERM | ARCHIVE_EXTRACT_OWNER);
		assertA(0 == archive_write_header(a, ae));
		/* Owner change should fail here. */
		failure("Non-opportunistic SUID failure should return error.");
		assertEqualInt(ARCHIVE_WARN, archive_write_finish_entry(a));
	}

	/* Write a regular file with ARCHIVE_EXTRACT_PERM & SGID bit */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "file_perm_sgid");
	archive_entry_set_mode(ae, S_IFREG | S_ISGID | 0742);
	archive_entry_set_gid(ae, defaultgid());
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_PERM);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("Setting SGID bit should succeed here.");
	assertEqualIntA(a, 0, archive_write_finish_entry(a));

	if (altgid() == -1) {
		/*
		 * Current user must belong to at least two groups or
		 * else we can't test setting the GID to another group.
		 */
		skipping("Current user can't test gid restore: must belong to more than one group.");
	} else {
		/*
		 * Write a regular file with ARCHIVE_EXTRACT_PERM & SGID bit
		 * but without ARCHIVE_EXTRACT_OWNER.
		 */
		/*
		 * This is a weird case: The user has asked for permissions to
		 * be restored but not asked for ownership to be restored.  As
		 * a result, the default file creation will create a file with
		 * the wrong group.  There are several possible behaviors for
		 * libarchive in this scenario:
		 *  = Set the SGID bit.  It is wrong and a security hole to
		 *    set SGID with the wrong group.  Even POSIX thinks so.
		 *  = Implicitly set the group.  I don't like this.
		 *  = drop the SGID bit and warn (the old libarchive behavior)
		 *  = drop the SGID bit and don't warn (the current libarchive
		 *    behavior).
		 * The current behavior sees SGID/SUID restore when you
		 * don't ask for owner restore as an "opportunistic"
		 * action.  That is, libarchive should do it if it can,
		 * but if it can't, it's not an error.
		 */
		assert(archive_entry_clear(ae) != NULL);
		archive_entry_copy_pathname(ae, "file_alt_sgid");
		archive_entry_set_mode(ae, S_IFREG | S_ISGID | 0742);
		archive_entry_set_uid(ae, getuid());
		archive_entry_set_gid(ae, altgid());
		archive_write_disk_set_options(a, ARCHIVE_EXTRACT_PERM);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Setting SGID bit should fail because of group mismatch but the failure should be silent because we didn't ask for the group to be set.");
		assertEqualIntA(a, 0, archive_write_finish_entry(a));

		/*
		 * As above, but add _EXTRACT_OWNER to verify that it
		 * does succeed.
		 */
		assert(archive_entry_clear(ae) != NULL);
		archive_entry_copy_pathname(ae, "file_alt_sgid_owner");
		archive_entry_set_mode(ae, S_IFREG | S_ISGID | 0742);
		archive_entry_set_uid(ae, getuid());
		archive_entry_set_gid(ae, altgid());
		archive_write_disk_set_options(a,
		    ARCHIVE_EXTRACT_PERM | ARCHIVE_EXTRACT_OWNER);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Setting SGID bit should succeed here.");
		assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));
	}

	/*
	 * Write a regular file with ARCHIVE_EXTRACT_PERM & SGID bit,
	 * but wrong GID.  POSIX says you shouldn't restore SGID bit
	 * unless the GID could be restored.
	 */
	if (invalidgid() == -1) {
		/* This test always fails for root. */
		printf("Running as root: Can't test SGID failures.\n");
	} else {
		assert(archive_entry_clear(ae) != NULL);
		archive_entry_copy_pathname(ae, "file_bad_sgid");
		archive_entry_set_mode(ae, S_IFREG | S_ISGID | 0742);
		archive_entry_set_gid(ae, invalidgid());
		archive_write_disk_set_options(a, ARCHIVE_EXTRACT_PERM);
		assertA(0 == archive_write_header(a, ae));
		failure("This SGID restore should fail without an error.");
		assertEqualIntA(a, 0, archive_write_finish_entry(a));

		assert(archive_entry_clear(ae) != NULL);
		archive_entry_copy_pathname(ae, "file_bad_sgid2");
		archive_entry_set_mode(ae, S_IFREG | S_ISGID | 0742);
		archive_entry_set_gid(ae, invalidgid());
		archive_write_disk_set_options(a,
		    ARCHIVE_EXTRACT_PERM | ARCHIVE_EXTRACT_OWNER);
		assertA(0 == archive_write_header(a, ae));
		failure("This SGID restore should fail with an error.");
		assertEqualIntA(a, ARCHIVE_WARN, archive_write_finish_entry(a));
	}

	/* Set ownership should fail if we're not root. */
	if (getuid() == 0) {
		printf("Running as root: Can't test setuid failures.\n");
	} else {
		assert(archive_entry_clear(ae) != NULL);
		archive_entry_copy_pathname(ae, "file_bad_owner");
		archive_entry_set_mode(ae, S_IFREG | 0744);
		archive_entry_set_uid(ae, getuid() + 1);
		archive_write_disk_set_options(a, ARCHIVE_EXTRACT_OWNER);
		assertA(0 == archive_write_header(a, ae));
		assertEqualIntA(a,ARCHIVE_WARN,archive_write_finish_entry(a));
	}

	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	archive_entry_free(ae);

	/* Test the entries on disk. */
	assertEqualInt(0, stat("file_0755", &st));
	failure("file_0755: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, 0755);

	assertEqualInt(0, stat("file_overwrite_0144", &st));
	failure("file_overwrite_0144: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, 0144);

	assertEqualInt(0, stat("dir_0514", &st));
	failure("dir_0514: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, 0514);

	assertEqualInt(0, stat("dir_overwrite_0744", &st));
	failure("dir_overwrite_0744: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 0777, 0744);

	assertEqualInt(0, stat("file_no_suid", &st));
	failure("file_0755: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, 0755);

	assertEqualInt(0, stat("file_0777", &st));
	failure("file_0777: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, 0777);

	/* SUID bit should get set here. */
	assertEqualInt(0, stat("file_4742", &st));
	failure("file_4742: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, S_ISUID | 0742);

	/* SUID bit should NOT have been set here. */
	assertEqualInt(0, stat("file_bad_suid", &st));
	failure("file_bad_suid: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, 0742);

	/* Some things don't fail if you're root, so suppress this. */
	if (getuid() != 0) {
		/* SUID bit should NOT have been set here. */
		assertEqualInt(0, stat("file_bad_suid2", &st));
		failure("file_bad_suid2: st.st_mode=%o", st.st_mode);
		assertEqualInt(st.st_mode & 07777, 0742);
	}

	/* SGID should be set here. */
	assertEqualInt(0, stat("file_perm_sgid", &st));
	failure("file_perm_sgid: st.st_mode=%o", st.st_mode);
	assertEqualInt(st.st_mode & 07777, S_ISGID | 0742);

	if (altgid() != -1) {
		/* SGID should not be set here. */
		assertEqualInt(0, stat("file_alt_sgid", &st));
		failure("file_alt_sgid: st.st_mode=%o", st.st_mode);
		assertEqualInt(st.st_mode & 07777, 0742);

		/* SGID should be set here. */
		assertEqualInt(0, stat("file_alt_sgid_owner", &st));
		failure("file_alt_sgid: st.st_mode=%o", st.st_mode);
		assertEqualInt(st.st_mode & 07777, S_ISGID | 0742);
	}

	if (invalidgid() != -1) {
		/* SGID should NOT be set here. */
		assertEqualInt(0, stat("file_bad_sgid", &st));
		failure("file_bad_sgid: st.st_mode=%o", st.st_mode);
		assertEqualInt(st.st_mode & 07777, 0742);
		/* SGID should NOT be set here. */
		assertEqualInt(0, stat("file_bad_sgid2", &st));
		failure("file_bad_sgid2: st.st_mode=%o", st.st_mode);
		assertEqualInt(st.st_mode & 07777, 0742);
	}

	if (getuid() != 0) {
		assertEqualInt(0, stat("file_bad_owner", &st));
		failure("file_bad_owner: st.st_mode=%o", st.st_mode);
		assertEqualInt(st.st_mode & 07777, 0744);
		failure("file_bad_owner: st.st_uid=%jd getuid()=%jd",
		    (intmax_t)st.st_uid, (intmax_t)getuid());
		/* The entry had getuid()+1, but because we're
		 * not root, we should not have been able to set that. */
		assertEqualInt(st.st_uid, getuid());
	}
#endif
}